

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# body_centered_cubic.hpp
# Opt level: O1

bool __thiscall
sisl::body_centered_cubic<char>::is_lattice_site
          (body_centered_cubic<char> *this,int d0,__va_list_tag *vl)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  byte *pbVar4;
  int _x;
  
  uVar1 = vl->gp_offset;
  if ((ulong)uVar1 < 0x29) {
    puVar3 = (uint *)((ulong)uVar1 + (long)vl->reg_save_area);
    vl->gp_offset = uVar1 + 8;
  }
  else {
    puVar3 = (uint *)vl->overflow_arg_area;
    vl->overflow_arg_area = puVar3 + 2;
  }
  uVar1 = *puVar3;
  uVar2 = vl->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    pbVar4 = (byte *)((ulong)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    pbVar4 = (byte *)vl->overflow_arg_area;
    vl->overflow_arg_area = pbVar4 + 8;
  }
  if ((*pbVar4 & 1) == 0) {
    if (((d0 & 0x80000001U) == 1) || ((uVar1 & 0x80000001) == 1)) {
      return false;
    }
  }
  else if ((d0 & uVar1 & 1) == 0) {
    return false;
  }
  return true;
}

Assistant:

virtual bool is_lattice_site(int d0, va_list vl) const {
            int _x = d0, _y = 0, _z = 0;

            _y = va_arg(vl, int);
            _z = va_arg(vl, int);

            if((_z % 2)) {
                if((_y % 2) == 0 || (_x % 2) == 0) {
                    return false;
                }
            } else if((_y % 2) == 1 || (_x % 2) == 1) {
                return false;
            }
            return true;
        }